

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O1

bool operator==(cmLinkItem *l,cmLinkItem *r)

{
  size_t __n;
  int iVar1;
  
  if ((l->Target == r->Target) &&
     (__n = (l->String)._M_string_length, __n == (r->String)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((l->String)._M_dataplus._M_p,(r->String)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(cmLinkItem const& l, cmLinkItem const& r)
{
  return l.Target == r.Target && l.String == r.String;
}